

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCo.c
# Opt level: O3

Gia_Man_t *
Gia_PolynCoreDetectTest_int(Gia_Man_t *pGia,Vec_Int_t *vAddCos,int fAddCones,int fVerbose)

{
  int iVar1;
  Vec_Int_t *vAdds;
  Vec_Int_t *vOrder;
  Vec_Int_t *vNodes;
  Gia_Man_t *pGVar2;
  long lVar3;
  int level;
  long lVar4;
  Vec_Int_t *vLeaves;
  timespec ts;
  Vec_Int_t *vRoots;
  Vec_Int_t *local_60;
  int local_58;
  int local_54;
  timespec local_50;
  Vec_Int_t *local_40;
  Vec_Int_t *local_38;
  
  local_58 = fVerbose;
  local_54 = fAddCones;
  iVar1 = clock_gettime(3,&local_50);
  if (iVar1 < 0) {
    lVar3 = 1;
  }
  else {
    lVar3 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_50.tv_nsec),8);
    lVar3 = ((lVar3 >> 7) - (lVar3 >> 0x3f)) + local_50.tv_sec * -1000000;
  }
  vAdds = Ree_ManComputeCuts(pGia,(Vec_Int_t **)0x0,1);
  local_40 = vAddCos;
  vOrder = Gia_PolynCoreOrder(pGia,vAdds,vAddCos,&local_60,&local_38);
  vNodes = Gia_PolynCoreCollect(pGia,vAdds,vOrder);
  printf("Detected %d FAs/HAs. Roots = %d. Leaves = %d. Nodes = %d. Adds = %d. ",
         (ulong)(uint)(vAdds->nSize / 6),(ulong)(uint)local_60->nSize,(ulong)(uint)local_38->nSize,
         (ulong)(uint)vNodes->nSize,(ulong)(uint)vOrder->nSize);
  level = 3;
  iVar1 = clock_gettime(3,&local_50);
  if (iVar1 < 0) {
    lVar4 = -1;
  }
  else {
    lVar4 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
  }
  Abc_Print(level,"%s =","Time");
  Abc_Print(level,"%9.2f sec\n",(double)(lVar4 + lVar3) / 1000000.0);
  Gia_PolynCorePrintCones(pGia,local_60,local_58);
  pGVar2 = Gia_PolynCoreDupTree(pGia,local_40,local_60,vNodes,local_54);
  if (vAdds->pArray != (int *)0x0) {
    free(vAdds->pArray);
  }
  free(vAdds);
  if (local_60->pArray != (int *)0x0) {
    free(local_60->pArray);
  }
  free(local_60);
  if (local_38->pArray != (int *)0x0) {
    free(local_38->pArray);
  }
  free(local_38);
  if (vOrder->pArray != (int *)0x0) {
    free(vOrder->pArray);
  }
  free(vOrder);
  if (vNodes->pArray != (int *)0x0) {
    free(vNodes->pArray);
  }
  free(vNodes);
  return pGVar2;
}

Assistant:

Gia_Man_t * Gia_PolynCoreDetectTest_int( Gia_Man_t * pGia, Vec_Int_t * vAddCos, int fAddCones, int fVerbose )
{
    extern Vec_Int_t * Ree_ManComputeCuts( Gia_Man_t * p, Vec_Int_t ** pvXors, int fVerbose );
    abctime clk = Abc_Clock();
    Gia_Man_t * pNew;
    Vec_Int_t * vAdds = Ree_ManComputeCuts( pGia, NULL, 1 );
    Vec_Int_t * vLeaves, * vRoots, * vOrder = Gia_PolynCoreOrder( pGia, vAdds, vAddCos, &vLeaves, &vRoots );
    Vec_Int_t * vNodes = Gia_PolynCoreCollect( pGia, vAdds, vOrder );

    //Gia_ManShow( pGia, vNodes, 0 );
    
    printf( "Detected %d FAs/HAs. Roots = %d. Leaves = %d. Nodes = %d. Adds = %d. ", 
        Vec_IntSize(vAdds)/6, Vec_IntSize(vLeaves), Vec_IntSize(vRoots), Vec_IntSize(vNodes), Vec_IntSize(vOrder) );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );

    Gia_PolynCorePrintCones( pGia, vLeaves, fVerbose );

    pNew = Gia_PolynCoreDupTree( pGia, vAddCos, vLeaves, vNodes, fAddCones );

    Vec_IntFree( vAdds );
    Vec_IntFree( vLeaves );
    Vec_IntFree( vRoots );
    Vec_IntFree( vOrder );
    Vec_IntFree( vNodes );
    return pNew;
}